

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::FboTestUtil::TextureCubeArrayShader::shadeVertices
          (TextureCubeArrayShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  ulong uVar2;
  ulong uVar3;
  Vec2 a_coord;
  Vec3 v_coord;
  Mat3 texCoordMat;
  VecAccess<float,_4,_2> local_90;
  VertexAttrib *local_80;
  VertexPacket **local_78;
  Vector<float,_4> *local_70;
  undefined8 local_68;
  deUint32 local_60;
  Matrix<float,_3,_3> local_54;
  
  local_78 = packets;
  tcu::Matrix<float,_3,_3>::Matrix
            (&local_54,
             &(((this->super_ShaderProgram).m_uniforms.
                super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
                super__Vector_impl_data._M_start)->value).f);
  uVar3 = 0;
  uVar2 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar2 = uVar3;
  }
  local_80 = inputs;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    pVVar1 = local_78[uVar3];
    rr::readVertexAttribFloat((rr *)&local_68,inputs + 1,pVVar1->instanceNdx,pVVar1->vertexNdx);
    local_90.m_index[0] = 0;
    local_90.m_index[1] = 1;
    local_90.m_vector = (Vector<float,_4> *)&local_68;
    tcu::VecAccess::operator_cast_to_Vector(&local_90);
    local_90.m_vector = local_70;
    local_90.m_index[0] = 0x3f800000;
    tcu::operator*((tcu *)&local_68,&local_54,(Vector<float,_3> *)&local_90);
    rr::readVertexAttribFloat((rr *)&local_90,local_80,pVVar1->instanceNdx,pVVar1->vertexNdx);
    *(Vector<float,_4> **)(pVVar1->position).m_data = local_90.m_vector;
    *(int (*) [2])((pVVar1->position).m_data + 2) = local_90.m_index;
    *(undefined8 *)&pVVar1->outputs[0].v = local_68;
    pVVar1->outputs[0].v.uData[2] = local_60;
    pVVar1->outputs[0].v.uData[3] = 0;
  }
  return;
}

Assistant:

void TextureCubeArrayShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	tcu::Mat3 texCoordMat = tcu::Mat3(m_uniforms[0].value.m3);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::VertexPacket&	packet	= *packets[packetNdx];
		const tcu::Vec2		a_coord = rr::readVertexAttribFloat(inputs[1], packet.instanceNdx, packet.vertexNdx).xy();
		const tcu::Vec3		v_coord = texCoordMat * tcu::Vec3(a_coord.x(), a_coord.y(), 1.0f);

		packet.position = rr::readVertexAttribFloat(inputs[0], packet.instanceNdx, packet.vertexNdx);
		packet.outputs[0] = tcu::Vec4(v_coord.x(), v_coord.y(), v_coord.z(), 0.0f);
	}
}